

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O3

void row_stop(int t)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  ulong uVar5;
  
  iVar1 = 4;
  if (t != 6) {
    iVar1 = t;
  }
  if (iVar1 == 7) {
    iVar1 = 0;
  }
  plVar4 = &Seed[0].boundary;
  uVar5 = 0;
  do {
    if ((((seed_t *)(plVar4 + -3))->table == (long)iVar1) ||
       (((seed_t *)(plVar4 + -3))->table == (long)tdefs[iVar1].child)) {
      if (set_seeds == 0) {
        lVar2 = plVar4[-1];
        lVar3 = *plVar4;
      }
      else {
        lVar2 = plVar4[-1];
        lVar3 = *plVar4;
        if (lVar3 < lVar2) {
          fprintf(_stderr,"\nSEED CHANGE: seed[%d].usage = %ld\n",uVar5 & 0xffffffff);
          *plVar4 = plVar4[-1];
          goto LAB_00107802;
        }
      }
      NthElement(lVar3 - lVar2,plVar4 + -2);
    }
LAB_00107802:
    uVar5 = uVar5 + 1;
    plVar4 = plVar4 + 4;
    if (uVar5 == 0x32) {
      return;
    }
  } while( true );
}

Assistant:

void
row_stop(int t)	\
	{ 
	int i;
	
	/* need to allow for handling the master and detail together */
	if (t == ORDER_LINE)
		t = ORDER;
	if (t == PART_PSUPP)
		t = PART;
	
	for (i=0; i <= MAX_STREAM; i++)
		{
		if ((Seed[i].table == t) || (Seed[i].table == tdefs[t].child))
			{ 
			if (set_seeds && (Seed[i].usage > Seed[i].boundary))
				{
				fprintf(stderr, "\nSEED CHANGE: seed[%d].usage = %ld\n",
					i, Seed[i].usage); 
				Seed[i].boundary = Seed[i].usage;
				} 
			else 
				{
				NthElement((Seed[i].boundary - Seed[i].usage), &Seed[i].value);
				}
			} 
		}
	return;
	}